

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O2

void plutovg_text_iterator_init
               (plutovg_text_iterator_t *it,void *text,int length,plutovg_text_encoding_t encoding)

{
  ulong uVar1;
  
  uVar1 = (ulong)(uint)length;
  if (length == -1) {
    if (encoding < PLUTOVG_TEXT_ENCODING_UTF16) {
      for (uVar1 = 0; *(char *)((long)text + uVar1) != '\0'; uVar1 = uVar1 + 1) {
      }
    }
    else if (encoding == PLUTOVG_TEXT_ENCODING_UTF16) {
      for (uVar1 = 0; *(short *)((long)text + uVar1 * 2) != 0; uVar1 = uVar1 + 1) {
      }
    }
    else {
      if (encoding != PLUTOVG_TEXT_ENCODING_UTF32) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-font.c"
                      ,0x20,
                      "int plutovg_text_iterator_length(const void *, plutovg_text_encoding_t)");
      }
      for (uVar1 = 0; *(int *)((long)text + uVar1 * 4) != 0; uVar1 = uVar1 + 1) {
      }
    }
  }
  it->text = text;
  it->length = (int)uVar1;
  it->encoding = encoding;
  it->index = 0;
  return;
}

Assistant:

void plutovg_text_iterator_init(plutovg_text_iterator_t* it, const void* text, int length, plutovg_text_encoding_t encoding)
{
    if(length == -1)
        length = plutovg_text_iterator_length(text, encoding);
    it->text = text;
    it->length = length;
    it->encoding = encoding;
    it->index = 0;
}